

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

void __thiscall
StyleParser::parse_paint
          (StyleParser *this,shared_ptr<PaintServer> *paint,PaintServerMap *paint_servers)

{
  char *pcVar1;
  bool bVar2;
  const_iterator cVar3;
  StringView id;
  string local_68;
  Color local_40;
  
  bVar2 = Parser::parse(&this->super_Parser,"none");
  if (bVar2) {
    local_68._M_dataplus._M_p = (pointer)0x0;
    local_68._M_string_length = 0;
    std::__shared_ptr<PaintServer,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&paint->super___shared_ptr<PaintServer,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<PaintServer,_(__gnu_cxx::_Lock_policy)2> *)&local_68);
  }
  else {
    bVar2 = Parser::parse(&this->super_Parser,"inherit");
    if (bVar2) {
      return;
    }
    bVar2 = Parser::parse(&this->super_Parser,"url");
    if (bVar2) {
      local_68._M_dataplus._M_p = "(";
      local_68._M_string_length = StringView::strlen((StringView *)"(",(char *)0x0);
      Parser::expect(&this->super_Parser,(StringView *)&local_68);
      local_68._M_dataplus._M_p = "#";
      local_68._M_string_length = StringView::strlen((StringView *)"#",(char *)0x0);
      Parser::expect(&this->super_Parser,(StringView *)&local_68);
      pcVar1 = (this->super_Parser).s.s;
      Parser::
      parse_all<StyleParser::parse_paint(std::shared_ptr<PaintServer>&,std::map<StringView,std::shared_ptr<PaintServer>,std::less<StringView>,std::allocator<std::pair<StringView_const,std::shared_ptr<PaintServer>>>>const&)::_lambda(Character)_1_>
                (&this->super_Parser,(anon_class_1_0_00000001 *)&local_68);
      local_40._8_8_ = (long)(this->super_Parser).s.s - (long)pcVar1;
      local_40._0_8_ = pcVar1;
      local_68._M_dataplus._M_p = ")";
      local_68._M_string_length = StringView::strlen((StringView *)0x10fdef,(char *)0x0);
      Parser::expect(&this->super_Parser,(StringView *)&local_68);
      cVar3 = std::
              _Rb_tree<StringView,_std::pair<const_StringView,_std::shared_ptr<PaintServer>_>,_std::_Select1st<std::pair<const_StringView,_std::shared_ptr<PaintServer>_>_>,_std::less<StringView>,_std::allocator<std::pair<const_StringView,_std::shared_ptr<PaintServer>_>_>_>
              ::find(&paint_servers->_M_t,(key_type *)&local_40);
      if ((_Rb_tree_header *)cVar3._M_node != &(paint_servers->_M_t)._M_impl.super__Rb_tree_header)
      {
        std::__shared_ptr<PaintServer,_(__gnu_cxx::_Lock_policy)2>::operator=
                  (&paint->super___shared_ptr<PaintServer,_(__gnu_cxx::_Lock_policy)2>,
                   (__shared_ptr<PaintServer,_(__gnu_cxx::_Lock_policy)2> *)
                   &cVar3._M_node[1]._M_left);
        return;
      }
      StringView::to_string_abi_cxx11_(&local_68,(StringView *)&local_40);
      printf("url not found: %s\n",local_68._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&local_68);
      return;
    }
    local_40 = parse_color(this);
    std::make_shared<ColorPaintServer,Color>((Color *)&local_68);
    std::__shared_ptr<PaintServer,(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<PaintServer,(__gnu_cxx::_Lock_policy)2> *)paint,
               (__shared_ptr<ColorPaintServer,_(__gnu_cxx::_Lock_policy)2> *)&local_68);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_68._M_string_length);
  return;
}

Assistant:

void parse_paint(std::shared_ptr<PaintServer>& paint, const PaintServerMap& paint_servers) {
		if (parse("none")) {
			paint = nullptr;
		}
		else if (parse("inherit")) {

		}
		else if (parse("url")) {
			expect("(");
			expect("#");
			StringView start = get();
			parse_all([](Character c) {
				return c != ')';
			});
			StringView id = get() - start;
			expect(")");
			auto i = paint_servers.find(id);
			if (i == paint_servers.end()) {
				//error("invalid IRI: " + id.to_string());
				printf("url not found: %s\n", id.to_string().c_str());
			}
			else {
				paint = i->second;
			}
		}
		else {
			paint = std::make_shared<ColorPaintServer>(parse_color());
		}
	}